

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

resolve_t Curl_resolv_timeout(Curl_easy *data,char *hostname,int port,Curl_dns_entry **entry,
                             timediff_t timeoutms)

{
  undefined8 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint __seconds;
  timediff_t tVar4;
  ulong uVar5;
  curltime newer;
  curltime cVar6;
  curltime older;
  timediff_t local_1a8;
  unsigned_long alarm_set;
  timediff_t elapsed_secs;
  resolve_t rc;
  uint prev_alarm;
  long timeout;
  sigaction sigact;
  undefined1 local_d0 [7];
  _Bool keep_copysig;
  sigaction keep_sigact;
  timediff_t timeoutms_local;
  Curl_dns_entry **entry_local;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  sigact.sa_restorer._7_1_ = 0;
  elapsed_secs._4_4_ = 0;
  *entry = (Curl_dns_entry *)0x0;
  if (timeoutms < 0) {
    data_local._4_4_ = CURLRESOLV_TIMEDOUT;
  }
  else {
    if ((*(ulong *)&(data->set).field_0x8e2 >> 0x1f & 1) == 0) {
      local_1a8 = timeoutms;
      if (0x7fffffffffffffff < timeoutms) {
        local_1a8 = 0x7fffffffffffffff;
      }
      _rc = local_1a8;
    }
    else {
      _rc = 0;
    }
    keep_sigact.sa_restorer = (_func_void *)timeoutms;
    if (_rc == 0) {
      data_local._4_4_ = Curl_resolv(data,hostname,port,true,entry);
    }
    else if (_rc < 1000) {
      Curl_failf(data,"remaining timeout of %ld too small to resolve via SIGALRM method",_rc);
      data_local._4_4_ = CURLRESOLV_TIMEDOUT;
    }
    else {
      iVar3 = __sigsetjmp(curl_jmpenv,1);
      if (iVar3 == 0) {
        sigaction(0xe,(sigaction *)0x0,(sigaction *)&timeout);
        memcpy(local_d0,&timeout,0x98);
        sigact.sa_restorer._7_1_ = 1;
        timeout = (long)alarmfunc;
        sigact.sa_mask.__val[0xf]._0_4_ = (uint)sigact.sa_mask.__val[0xf] & 0xefffffff;
        sigaction(0xe,(sigaction *)&timeout,(sigaction *)0x0);
        __seconds = curlx_sltoui(_rc / 1000);
        elapsed_secs._4_4_ = alarm(__seconds);
        elapsed_secs._0_4_ = Curl_resolv(data,hostname,port,true,entry);
      }
      else {
        Curl_failf(data,"name lookup timed out");
        elapsed_secs._0_4_ = CURLRESOLV_ERROR;
      }
      if (elapsed_secs._4_4_ == 0) {
        alarm(0);
      }
      if ((sigact.sa_restorer._7_1_ & 1) != 0) {
        sigaction(0xe,(sigaction *)local_d0,(sigaction *)0x0);
      }
      if (elapsed_secs._4_4_ != 0) {
        cVar6 = Curl_now();
        uVar1 = (data->conn->created).tv_sec;
        uVar2 = (data->conn->created).tv_usec;
        older.tv_usec = uVar2;
        older.tv_sec = uVar1;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar6._0_12_,0);
        newer.tv_usec = SUB124(cVar6._0_12_,8);
        older._12_4_ = 0;
        tVar4 = Curl_timediff(newer,older);
        uVar5 = (ulong)elapsed_secs._4_4_ - tVar4 / 1000;
        if ((uVar5 == 0) || ((0x7fffffff < uVar5 && (elapsed_secs._4_4_ < 0x80000000)))) {
          alarm(1);
          elapsed_secs._0_4_ = CURLRESOLV_TIMEDOUT;
          Curl_failf(data,"Previous alarm fired off");
        }
        else {
          alarm((uint)uVar5);
        }
      }
      data_local._4_4_ = (resolve_t)elapsed_secs;
    }
  }
  return data_local._4_4_;
}

Assistant:

enum resolve_t Curl_resolv_timeout(struct Curl_easy *data,
                                   const char *hostname,
                                   int port,
                                   struct Curl_dns_entry **entry,
                                   timediff_t timeoutms)
{
#ifdef USE_ALARM_TIMEOUT
#ifdef HAVE_SIGACTION
  struct sigaction keep_sigact;   /* store the old struct here */
  volatile bool keep_copysig = FALSE; /* whether old sigact has been saved */
  struct sigaction sigact;
#else
#ifdef HAVE_SIGNAL
  void (*keep_sigact)(int);       /* store the old handler here */
#endif /* HAVE_SIGNAL */
#endif /* HAVE_SIGACTION */
  volatile long timeout;
  volatile unsigned int prev_alarm = 0;
#endif /* USE_ALARM_TIMEOUT */
  enum resolve_t rc;

  *entry = NULL;

  if(timeoutms < 0)
    /* got an already expired timeout */
    return CURLRESOLV_TIMEDOUT;

#ifdef USE_ALARM_TIMEOUT
  if(data->set.no_signal)
    /* Ignore the timeout when signals are disabled */
    timeout = 0;
  else
    timeout = (timeoutms > LONG_MAX) ? LONG_MAX : (long)timeoutms;

  if(!timeout)
    /* USE_ALARM_TIMEOUT defined, but no timeout actually requested */
    return Curl_resolv(data, hostname, port, TRUE, entry);

  if(timeout < 1000) {
    /* The alarm() function only provides integer second resolution, so if
       we want to wait less than one second we must bail out already now. */
    failf(data,
        "remaining timeout of %ld too small to resolve via SIGALRM method",
        timeout);
    return CURLRESOLV_TIMEDOUT;
  }
  /* This allows us to time-out from the name resolver, as the timeout
     will generate a signal and we will siglongjmp() from that here.
     This technique has problems (see alarmfunc).
     This should be the last thing we do before calling Curl_resolv(),
     as otherwise we'd have to worry about variables that get modified
     before we invoke Curl_resolv() (and thus use "volatile"). */
  if(sigsetjmp(curl_jmpenv, 1)) {
    /* this is coming from a siglongjmp() after an alarm signal */
    failf(data, "name lookup timed out");
    rc = CURLRESOLV_ERROR;
    goto clean_up;
  }
  else {
    /*************************************************************
     * Set signal handler to catch SIGALRM
     * Store the old value to be able to set it back later!
     *************************************************************/
#ifdef HAVE_SIGACTION
    sigaction(SIGALRM, NULL, &sigact);
    keep_sigact = sigact;
    keep_copysig = TRUE; /* yes, we have a copy */
    sigact.sa_handler = alarmfunc;
#ifdef SA_RESTART
    /* HPUX doesn't have SA_RESTART but defaults to that behavior! */
    sigact.sa_flags &= ~SA_RESTART;
#endif
    /* now set the new struct */
    sigaction(SIGALRM, &sigact, NULL);
#else /* HAVE_SIGACTION */
    /* no sigaction(), revert to the much lamer signal() */
#ifdef HAVE_SIGNAL
    keep_sigact = signal(SIGALRM, alarmfunc);
#endif
#endif /* HAVE_SIGACTION */

    /* alarm() makes a signal get sent when the timeout fires off, and that
       will abort system calls */
    prev_alarm = alarm(curlx_sltoui(timeout/1000L));
  }

#else
#ifndef CURLRES_ASYNCH
  if(timeoutms)
    infof(data, "timeout on name lookup is not supported");
#else
  (void)timeoutms; /* timeoutms not used with an async resolver */
#endif
#endif /* USE_ALARM_TIMEOUT */

  /* Perform the actual name resolution. This might be interrupted by an
   * alarm if it takes too long.
   */
  rc = Curl_resolv(data, hostname, port, TRUE, entry);

#ifdef USE_ALARM_TIMEOUT
clean_up:

  if(!prev_alarm)
    /* deactivate a possibly active alarm before uninstalling the handler */
    alarm(0);

#ifdef HAVE_SIGACTION
  if(keep_copysig) {
    /* we got a struct as it looked before, now put that one back nice
       and clean */
    sigaction(SIGALRM, &keep_sigact, NULL); /* put it back */
  }
#else
#ifdef HAVE_SIGNAL
  /* restore the previous SIGALRM handler */
  signal(SIGALRM, keep_sigact);
#endif
#endif /* HAVE_SIGACTION */

  /* switch back the alarm() to either zero or to what it was before minus
     the time we spent until now! */
  if(prev_alarm) {
    /* there was an alarm() set before us, now put it back */
    timediff_t elapsed_secs = Curl_timediff(Curl_now(),
                                            data->conn->created) / 1000;

    /* the alarm period is counted in even number of seconds */
    unsigned long alarm_set = (unsigned long)(prev_alarm - elapsed_secs);

    if(!alarm_set ||
       ((alarm_set >= 0x80000000) && (prev_alarm < 0x80000000)) ) {
      /* if the alarm time-left reached zero or turned "negative" (counted
         with unsigned values), we should fire off a SIGALRM here, but we
         won't, and zero would be to switch it off so we never set it to
         less than 1! */
      alarm(1);
      rc = CURLRESOLV_TIMEDOUT;
      failf(data, "Previous alarm fired off");
    }
    else
      alarm((unsigned int)alarm_set);
  }
#endif /* USE_ALARM_TIMEOUT */

  return rc;
}